

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_quadrature.cc
# Opt level: O0

tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *
lf::quad::GaussJacobi
          (tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,quadDegree_t num_points,double alpha,double beta)

{
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
  *this;
  type_conflict2 tVar1;
  ulong __n;
  runtime_error *this_00;
  reference pvVar2;
  Scalar *pSVar3;
  exponent_type *peVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  type tVar6;
  type tVar7;
  type tVar8;
  uint local_114c;
  undefined1 local_1148 [4];
  quadDegree_t i_1;
  VectorXd points_result;
  double local_1128;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_1120;
  double local_1110;
  double local_1108;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_1100;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_10f0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_10e0;
  double local_10d0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_10c8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_10b8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_10a8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_1098;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_1088;
  string local_1078;
  allocator<char> local_1051;
  string local_1050;
  allocator<char> local_1029;
  string local_1028;
  stringstream local_1008 [8];
  stringstream ss_3;
  ostream local_ff8 [376];
  double local_e80;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e78;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e68;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e58;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e48;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e38;
  double local_e28;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e20;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_e10;
  double local_e00;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_df8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_de8;
  double local_dd8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_dd0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_dc0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_db0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_da0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d90;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d80;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d70;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d60;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d50;
  double local_d40;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d38;
  double local_d28;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d20;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d10;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_d00;
  double local_cf0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ce8;
  double local_cd8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_cd0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_cc0;
  double local_cb0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ca8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c98;
  uint local_c84;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c80;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c70;
  uint local_c5c;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c58;
  uint local_c44;
  double dStack_c40;
  quadDegree_t j;
  double local_c38;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  double local_c20;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c18;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_c08;
  double local_bf8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_bf0;
  uint local_bdc;
  double dStack_bd8;
  quadDegree_t its;
  double local_bd0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_bc8;
  double local_bb8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ba0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b90;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b80;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b70;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b60;
  self_type local_b50;
  double local_b40;
  double local_b38;
  double local_b30;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b18;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_b08;
  self_type local_af8;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ad0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ac0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  self_type local_aa0;
  double local_a90;
  double local_a88;
  double local_a80;
  double local_a78;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_a70;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_a60;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_a50;
  self_type local_a40;
  double local_a30;
  double local_a28;
  double local_a20;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_a18;
  double local_a08;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_a00;
  double local_9f0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_9e8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_9d8;
  double local_9c8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_9c0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  double local_9a0;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_998;
  double local_988;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_980;
  double local_970;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_968;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_958;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_948;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_938;
  double local_928;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_920;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_910;
  double local_900;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_8f8;
  double local_8e8;
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  local_8e0;
  double local_8d0;
  double local_8c8;
  uint local_8bc;
  undefined1 local_8b8 [4];
  quadDegree_t i;
  VectorXd weights;
  undefined1 local_8a0 [8];
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
  points;
  scalar_t z1;
  scalar_t z;
  scalar_t temp;
  scalar_t pp;
  scalar_t p3;
  scalar_t p2;
  scalar_t p1;
  scalar_t c;
  scalar_t b;
  scalar_t a;
  scalar_t r3;
  scalar_t r2;
  scalar_t r1;
  scalar_t bn;
  scalar_t an;
  scalar_t alfbet;
  int MAX_IT;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  stringstream local_6a0 [8];
  stringstream ss_2;
  ostream local_690 [383];
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [383];
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  double local_28;
  double beta_local;
  double alpha_local;
  tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *ptStack_10
  ;
  quadDegree_t num_points_local;
  
  local_28 = beta;
  beta_local = alpha;
  alpha_local._4_4_ = num_points;
  ptStack_10 = __return_storage_ptr__;
  if (num_points == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"num_points must be positive.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"num_points > 0",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x4a,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x4a,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  if (alpha <= -1.0) {
    std::__cxx11::stringstream::stringstream(local_430);
    std::operator<<(local_420,"alpha > -1 required");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"alpha > -1",&local_451)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_479);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_450,&local_478,0x4b,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"",&local_511);
    lf::base::AssertionFailed(&local_4c0,&local_4e8,0x4b,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    abort();
  }
  if (beta <= -1.0) {
    std::__cxx11::stringstream::stringstream(local_6a0);
    std::operator<<(local_690,"beta > -1 required.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"beta > -1",&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_6e9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6c0,&local_6e8,0x4c,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"false",&local_731);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_758,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
               ,&local_759);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&MAX_IT,"",(allocator<char> *)&alfbet.m_backend.field_0xf);
    lf::base::AssertionFailed(&local_730,&local_758,0x4c,(string *)&MAX_IT);
    std::__cxx11::string::~string((string *)&MAX_IT);
    std::allocator<char>::~allocator((allocator<char> *)&alfbet.m_backend.field_0xf);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator(&local_759);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    abort();
  }
  alfbet.m_backend.m_exponent = 10;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&an.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&bn.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&r1.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&r2.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&r3.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&a.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&b.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&c.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&p1.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&p2.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&p3.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&pp.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&temp.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&z.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&z1.m_backend.m_exponent);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
  ::number((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            *)&points.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __n = (ulong)alpha_local._4_4_;
  this = (allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
          *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows + 7);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocator(this);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
            *)local_8a0,__n,this);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>
                *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows + 7));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_8b8,(uint *)((long)&alpha_local + 4));
  local_8bc = 0;
  do {
    if (alpha_local._4_4_ <= local_8bc) {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
                ((Matrix<double,__1,_1,_0,__1,_1> *)local_1148,(uint *)((long)&alpha_local + 4));
      for (local_114c = 0; local_114c < alpha_local._4_4_; local_114c = local_114c + 1) {
        pvVar2 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)local_8a0,(ulong)local_114c);
        dVar5 = boost::multiprecision::
                number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                ::convert_to<double>(pvVar2);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1148
                            ,(ulong)local_114c);
        *pSVar3 = dVar5;
      }
      std::tuple<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
      tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_true>
                (__return_storage_ptr__,(Matrix<double,__1,_1,_0,__1,_1> *)local_1148,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_8b8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1148)
      ;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_8b8);
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                 *)local_8a0);
      return __return_storage_ptr__;
    }
    if (local_8bc == 0) {
      local_8c8 = beta_local / (double)alpha_local._4_4_;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&bn.m_backend.m_exponent,&local_8c8);
      local_8d0 = local_28 / (double)alpha_local._4_4_;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r1.m_backend.m_exponent,&local_8d0);
      local_8e8 = beta_local + 1.0;
      local_900 = 2.78 / ((double)(alpha_local._4_4_ * alpha_local._4_4_) + 4.0);
      local_928 = 0.768;
      boost::multiprecision::operator*
                ((multiprecision *)&local_920,&local_928,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&bn.m_backend.m_exponent);
      boost::multiprecision::operator/
                ((multiprecision *)&local_910,&local_920,(uint *)((long)&alpha_local + 4));
      boost::multiprecision::operator+((multiprecision *)&local_8f8,&local_900,&local_910);
      boost::multiprecision::operator*((multiprecision *)&local_8e0,&local_8e8,&local_8f8);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&r2.m_backend.m_exponent,&local_8e0);
      local_970 = 1.0;
      local_988 = 1.48;
      boost::multiprecision::operator*
                ((multiprecision *)&local_980,&local_988,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&bn.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_968,&local_970,&local_980);
      local_9a0 = 0.96;
      boost::multiprecision::operator*
                ((multiprecision *)&local_998,&local_9a0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r1.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_958,&local_968,&local_998);
      local_9c8 = 0.452;
      boost::multiprecision::operator*
                ((multiprecision *)&local_9c0,&local_9c8,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&bn.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_9b0,&local_9c0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&bn.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_948,&local_958,&local_9b0);
      local_9f0 = 0.83;
      boost::multiprecision::operator*
                ((multiprecision *)&local_9e8,&local_9f0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&bn.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_9d8,&local_9e8,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r1.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_938,&local_948,&local_9d8);
      peVar4 = &r3.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)peVar4,&local_938);
      local_a08 = 1.0;
      boost::multiprecision::operator/
                ((multiprecision *)&local_a18,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r2.m_backend.m_exponent,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4);
      boost::multiprecision::operator-((multiprecision *)&local_a00,&local_a08,&local_a18);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&z1.m_backend.m_exponent,&local_a00);
    }
    else if (local_8bc == 1) {
      local_a20 = (beta_local + 4.1) / ((beta_local + 1.0) * (beta_local * 0.156 + 1.0));
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r2.m_backend.m_exponent,&local_a20);
      local_a28 = (((double)alpha_local._4_4_ + -8.0) * 0.06 * (beta_local * 0.12 + 1.0)) /
                  (double)alpha_local._4_4_ + 1.0;
      peVar4 = &r3.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)peVar4,&local_a28);
      dVar5 = local_28 * 0.012;
      std::abs((int)peVar4);
      local_a30 = (dVar5 * (extraout_XMM0_Qa * 0.25 + 1.0)) / (double)alpha_local._4_4_ + 1.0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&a.m_backend.m_exponent,&local_a30);
      local_a78 = 1.0;
      boost::multiprecision::operator-
                ((multiprecision *)&local_a70,&local_a78,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_a60,&local_a70,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r2.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_a50,&local_a60,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r3.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_a40,&local_a50,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&a.m_backend.m_exponent);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator-=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z1.m_backend.m_exponent,&local_a40);
    }
    else if (local_8bc == 2) {
      local_a80 = (beta_local * 0.28 + 1.67) / (beta_local * 0.37 + 1.0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r2.m_backend.m_exponent,&local_a80);
      local_a88 = (((double)alpha_local._4_4_ + -8.0) * 0.22) / (double)alpha_local._4_4_ + 1.0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r3.m_backend.m_exponent,&local_a88);
      local_a90 = (local_28 * 8.0) /
                  ((local_28 + 6.28) * (double)alpha_local._4_4_ * (double)alpha_local._4_4_) + 1.0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&a.m_backend.m_exponent,&local_a90);
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,0);
      boost::multiprecision::operator-
                ((multiprecision *)&local_ad0,pvVar2,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_ac0,&local_ad0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r2.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_ab0,&local_ac0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r3.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_aa0,&local_ab0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&a.m_backend.m_exponent);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator-=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z1.m_backend.m_exponent,&local_aa0);
    }
    else if (local_8bc == alpha_local._4_4_ - 2) {
      local_ad8 = (local_28 * 0.235 + 1.0) / (local_28 * 0.119 + 0.766);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r2.m_backend.m_exponent,&local_ad8);
      local_ae0 = 1.0 / ((((double)alpha_local._4_4_ + -4.0) * 0.639) /
                         (((double)alpha_local._4_4_ + -4.0) * 0.71 + 1.0) + 1.0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r3.m_backend.m_exponent,&local_ae0);
      local_ae8 = 1.0 / ((beta_local * 20.0) /
                         ((beta_local + 7.5) * (double)alpha_local._4_4_ * (double)alpha_local._4_4_
                         ) + 1.0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&a.m_backend.m_exponent,&local_ae8);
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,(ulong)(alpha_local._4_4_ - 4));
      boost::multiprecision::operator-
                ((multiprecision *)&local_b28,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent,pvVar2);
      boost::multiprecision::operator*
                ((multiprecision *)&local_b18,&local_b28,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r2.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_b08,&local_b18,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r3.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_af8,&local_b08,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&a.m_backend.m_exponent);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z1.m_backend.m_exponent,&local_af8);
    }
    else if (local_8bc == alpha_local._4_4_ - 1) {
      local_b30 = (local_28 * 0.37 + 1.0) / (local_28 * 0.28 + 1.67);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r2.m_backend.m_exponent,&local_b30);
      local_b38 = 1.0 / ((((double)alpha_local._4_4_ + -8.0) * 0.22) / (double)alpha_local._4_4_ +
                        1.0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&r3.m_backend.m_exponent,&local_b38);
      local_b40 = 1.0 / ((beta_local * 8.0) /
                         ((beta_local + 6.28) * (double)alpha_local._4_4_ *
                         (double)alpha_local._4_4_) + 1.0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&a.m_backend.m_exponent,&local_b40);
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,(ulong)(alpha_local._4_4_ - 3));
      boost::multiprecision::operator-
                ((multiprecision *)&local_b80,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent,pvVar2);
      boost::multiprecision::operator*
                ((multiprecision *)&local_b70,&local_b80,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r2.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_b60,&local_b70,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&r3.m_backend.m_exponent);
      boost::multiprecision::operator*
                ((multiprecision *)&local_b50,&local_b60,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&a.m_backend.m_exponent);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z1.m_backend.m_exponent,&local_b50);
    }
    else {
      local_bb8 = 3.0;
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,(ulong)(local_8bc - 1));
      boost::multiprecision::operator*((multiprecision *)&local_bb0,&local_bb8,pvVar2);
      local_bd0 = 3.0;
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,(ulong)(local_8bc - 2));
      boost::multiprecision::operator*((multiprecision *)&local_bc8,&local_bd0,pvVar2);
      boost::multiprecision::operator-((multiprecision *)&local_ba0,&local_bb0,&local_bc8);
      pvVar2 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)local_8a0,(ulong)(local_8bc - 3));
      boost::multiprecision::operator+((multiprecision *)&local_b90,&local_ba0,pvVar2);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&z1.m_backend.m_exponent,&local_b90);
    }
    dStack_bd8 = beta_local + local_28;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
    ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                 *)&an.m_backend.m_exponent,&stack0xfffffffffffff428);
    for (local_bdc = 1; local_bdc < 0xb; local_bdc = local_bdc + 1) {
      local_bf8 = 2.0;
      boost::multiprecision::operator+
                ((multiprecision *)&local_bf0,&local_bf8,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&an.m_backend.m_exponent);
      peVar4 = &z.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)peVar4,&local_bf0);
      local_c20 = beta_local - local_28;
      boost::multiprecision::operator*
                ((multiprecision *)&local_c30,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_c18,&local_c20,&local_c30);
      local_c38 = 2.0;
      boost::multiprecision::operator/((multiprecision *)&local_c08,&local_c18,&local_c38);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&p2.m_backend.m_exponent,&local_c08);
      dStack_c40 = 1.0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
                   *)&p3.m_backend.m_exponent,&stack0xfffffffffffff3c0);
      for (local_c44 = 2; local_c44 <= alpha_local._4_4_; local_c44 = local_c44 + 1) {
        peVar4 = &p3.m_backend.m_exponent;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&pp.m_backend.m_exponent,
                    (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)peVar4);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)peVar4,
                    (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&p2.m_backend.m_exponent);
        local_c5c = local_c44 * 2;
        boost::multiprecision::operator+
                  ((multiprecision *)&local_c58,&local_c5c,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&an.m_backend.m_exponent);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&z.m_backend.m_exponent,&local_c58);
        local_c84 = local_c44 * 2;
        boost::multiprecision::operator+
                  ((multiprecision *)&local_c98,&local_c44,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&an.m_backend.m_exponent);
        boost::multiprecision::operator*((multiprecision *)&local_c80,&local_c84,&local_c98);
        local_cb0 = 2.0;
        boost::multiprecision::operator-
                  ((multiprecision *)&local_ca8,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z.m_backend.m_exponent,&local_cb0);
        boost::multiprecision::operator*((multiprecision *)&local_c70,&local_c80,&local_ca8);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&b.m_backend.m_exponent,&local_c70);
        local_cd8 = 1.0;
        boost::multiprecision::operator-
                  ((multiprecision *)&local_cd0,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z.m_backend.m_exponent,&local_cd8);
        local_cf0 = beta_local * beta_local - local_28 * local_28;
        local_d28 = 2.0;
        boost::multiprecision::operator-
                  ((multiprecision *)&local_d20,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z.m_backend.m_exponent,&local_d28);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_d10,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z.m_backend.m_exponent,&local_d20);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_d00,&local_d10,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z1.m_backend.m_exponent);
        boost::multiprecision::operator+((multiprecision *)&local_ce8,&local_cf0,&local_d00);
        boost::multiprecision::operator*((multiprecision *)&local_cc0,&local_cd0,&local_ce8);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&c.m_backend.m_exponent,&local_cc0);
        dVar5 = (double)(local_c44 - 1) + beta_local;
        local_d40 = (dVar5 + dVar5) * ((double)(local_c44 - 1) + local_28);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_d38,&local_d40,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&z.m_backend.m_exponent);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&p1.m_backend.m_exponent,&local_d38);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_d70,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&c.m_backend.m_exponent,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&p3.m_backend.m_exponent);
        boost::multiprecision::operator*
                  ((multiprecision *)&local_d80,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&p1.m_backend.m_exponent,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&pp.m_backend.m_exponent);
        boost::multiprecision::operator-((multiprecision *)&local_d60,&local_d70,&local_d80);
        boost::multiprecision::operator/
                  ((multiprecision *)&local_d50,&local_d60,
                   (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                    *)&b.m_backend.m_exponent);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
        ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                     *)&p2.m_backend.m_exponent,&local_d50);
      }
      local_dd8 = beta_local - local_28;
      boost::multiprecision::operator*
                ((multiprecision *)&local_de8,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z.m_backend.m_exponent,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z1.m_backend.m_exponent);
      boost::multiprecision::operator-((multiprecision *)&local_dd0,&local_dd8,&local_de8);
      boost::multiprecision::operator*
                ((multiprecision *)&local_dc0,(uint *)((long)&alpha_local + 4),&local_dd0);
      boost::multiprecision::operator*
                ((multiprecision *)&local_db0,&local_dc0,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&p2.m_backend.m_exponent);
      dVar5 = (double)alpha_local._4_4_ + beta_local;
      local_e00 = (dVar5 + dVar5) * ((double)alpha_local._4_4_ + local_28);
      boost::multiprecision::operator*
                ((multiprecision *)&local_df8,&local_e00,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&p3.m_backend.m_exponent);
      boost::multiprecision::operator+((multiprecision *)&local_da0,&local_db0,&local_df8);
      local_e28 = 1.0;
      peVar4 = &z1.m_backend.m_exponent;
      boost::multiprecision::operator*
                ((multiprecision *)&local_e38,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4);
      boost::multiprecision::operator-((multiprecision *)&local_e20,&local_e28,&local_e38);
      boost::multiprecision::operator*
                ((multiprecision *)&local_e10,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&z.m_backend.m_exponent,&local_e20);
      boost::multiprecision::operator/((multiprecision *)&local_d90,&local_da0,&local_e10);
      peVar4 = &temp.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)peVar4,&local_d90);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&points.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)&z1.m_backend.m_exponent);
      boost::multiprecision::operator/
                ((multiprecision *)&local_e58,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&p2.m_backend.m_exponent,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4);
      boost::multiprecision::operator-
                ((multiprecision *)&local_e48,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&points.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_e58);
      peVar4 = &z1.m_backend.m_exponent;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
      ::operator=((number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                   *)peVar4,&local_e48);
      boost::multiprecision::operator-
                ((multiprecision *)&local_e78,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)peVar4,
                 (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                  *)&points.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::multiprecision::
      abs<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
                ((multiprecision *)&local_e68,&local_e78);
      local_e80 = 1e-17;
      tVar1 = boost::multiprecision::operator<=(&local_e68,&local_e80);
      if (tVar1) break;
    }
    if (10 < local_bdc) {
      std::__cxx11::stringstream::stringstream(local_1008);
      std::operator<<(local_ff8,"too many iterations.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1028,"its <= MAX_IT",&local_1029);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1050,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/gauss_quadrature.cc"
                 ,&local_1051);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1028,&local_1050,0xb2,&local_1078);
      std::__cxx11::string::~string((string *)&local_1078);
      std::__cxx11::string::~string((string *)&local_1050);
      std::allocator<char>::~allocator(&local_1051);
      std::__cxx11::string::~string((string *)&local_1028);
      std::allocator<char>::~allocator(&local_1029);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar2 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)local_8a0,(ulong)local_8bc);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
    ::operator=(pvVar2,(number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                        *)&z1.m_backend.m_exponent);
    tVar6 = boost::math::lgamma<double>(beta_local + (double)alpha_local._4_4_);
    tVar7 = boost::math::lgamma<double>(local_28 + (double)alpha_local._4_4_);
    tVar8 = boost::math::lgamma<double>((double)alpha_local._4_4_ + 1.0);
    local_10d0 = (tVar6 + tVar7) - tVar8;
    local_1108 = (double)alpha_local._4_4_;
    boost::multiprecision::operator+
              ((multiprecision *)&local_1100,&local_1108,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&an.m_backend.m_exponent);
    local_1110 = 1.0;
    boost::multiprecision::operator+((multiprecision *)&local_10f0,&local_1100,&local_1110);
    boost::multiprecision::
    lgamma<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,(boost::multiprecision::expression_template_option)0>
              ((multiprecision *)&local_10e0,&local_10f0);
    boost::multiprecision::operator-((multiprecision *)&local_10c8,&local_10d0,&local_10e0);
    boost::multiprecision::
    exp<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>>
              ((multiprecision *)&local_10b8,&local_10c8);
    boost::multiprecision::operator*
              ((multiprecision *)&local_10a8,&local_10b8,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&z.m_backend.m_exponent);
    local_1128 = 2.0;
    boost::multiprecision::
    pow<boost::multiprecision::backends::cpp_bin_float<57u,(boost::multiprecision::backends::digit_base_type)2,void,int,0,0>,double>
              ((multiprecision *)&local_1120,&local_1128,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&an.m_backend.m_exponent);
    boost::multiprecision::operator*((multiprecision *)&local_1098,&local_10a8,&local_1120);
    boost::multiprecision::operator*
              ((multiprecision *)
               &points_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&temp.m_backend.m_exponent,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&p3.m_backend.m_exponent);
    boost::multiprecision::operator/
              ((multiprecision *)&local_1088,&local_1098,
               (number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
                *)&points_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows);
    dVar5 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_bin_float<57U,_(boost::multiprecision::backends::digit_base_type)2,_void,_int,_0,_0>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<double>(&local_1088);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_8b8,
                        (ulong)local_8bc);
    *pSVar3 = dVar5;
    local_8bc = local_8bc + 1;
  } while( true );
}

Assistant:

std::tuple<Eigen::VectorXd, Eigen::VectorXd> GaussJacobi(
    quadDegree_t num_points, double alpha, double beta) {
  // NOLINTBEGIN(clang-analyzer-core.StackAddressEscape)
  LF_ASSERT_MSG(num_points > 0, "num_points must be positive.");
  LF_ASSERT_MSG(alpha > -1, "alpha > -1 required");
  LF_ASSERT_MSG(beta > -1, "beta > -1 required.");

  using boost::math::lgamma;
  using scalar_t =
      boost::multiprecision::number<boost::multiprecision::cpp_bin_float<
          57, boost::multiprecision::digit_base_2>>;

  const int MAX_IT = 10;

  scalar_t alfbet;
  scalar_t an;
  scalar_t bn;
  scalar_t r1;
  scalar_t r2;
  scalar_t r3;
  scalar_t a;
  scalar_t b;
  scalar_t c;
  scalar_t p1;
  scalar_t p2;
  scalar_t p3;
  scalar_t pp;
  scalar_t temp;
  scalar_t z;
  scalar_t z1;

  std::vector<scalar_t> points(num_points);
  Eigen::VectorXd weights(num_points);

  // Make an initial guess for the zeros:
  for (quadDegree_t i = 0; i < num_points; ++i) {
    if (i == 0) {
      // initial guess for the largest root
      an = alpha / num_points;
      bn = beta / num_points;
      r1 = (1.0 + alpha) *
           (2.78 / (4.0 + num_points * num_points) + 0.768 * an / num_points);
      r2 = 1.0 + 1.48 * an + 0.96 * bn + 0.452 * an * an + 0.83 * an * bn;
      z = 1.0 - r1 / r2;
    } else if (i == 1) {
      // initial guess for the second largest root
      r1 = (4.1 + alpha) / ((1.0 + alpha) * (1.0 + 0.156 * alpha));
      r2 = 1.0 + 0.06 * (num_points - 8.0) * (1.0 + 0.12 * alpha) / num_points;
      r3 = 1.0 + 0.012 * beta * (1.0 + 0.25 * std::abs(alpha)) / num_points;
      z -= (1.0 - z) * r1 * r2 * r3;
    } else if (i == 2) {
      // initial guess for the third largest root
      r1 = (1.67 + 0.28 * alpha) / (1.0 + 0.37 * alpha);
      r2 = 1.0 + 0.22 * (num_points - 8.0) / num_points;
      r3 = 1.0 + 8.0 * beta / ((6.28 + beta) * num_points * num_points);
      z -= (points[0] - z) * r1 * r2 * r3;
    } else if (i == num_points - 2) {
      // initial guess for the second smallest root
      r1 = (1.0 + 0.235 * beta) / (0.766 + 0.119 * beta);
      r2 = 1.0 / (1.0 + 0.639 * (num_points - 4.0) /
                            (1.0 + 0.71 * (num_points - 4.0)));
      r3 = 1.0 /
           (1.0 + 20.0 * alpha / ((7.5 + alpha) * num_points * num_points));
      z += (z - points[num_points - 4]) * r1 * r2 * r3;
    } else if (i == num_points - 1) {
      // initial guess for the smallest root
      r1 = (1.0 + 0.37 * beta) / (1.67 + 0.28 * beta);
      r2 = 1.0 / (1.0 + 0.22 * (num_points - 8.0) / num_points);
      r3 = 1.0 /
           (1.0 + 8.0 * alpha / ((6.28 + alpha) * num_points * num_points));
      z += (z - points[num_points - 3]) * r1 * r2 * r3;
    } else {
      // initial guess for the other points
      z = 3.0 * points[i - 1] - 3.0 * points[i - 2] + points[i - 3];
    }
    alfbet = alpha + beta;
    quadDegree_t its;
    for (its = 1; its <= MAX_IT; ++its) {
      // refinement by Newton's method
      temp = 2.0 + alfbet;

      // Start the recurrence with P_0 and P1 to avoid a division by zero when
      // alpha * beta = 0 or -1
      p1 = (alpha - beta + temp * z) / 2.0;
      p2 = 1.0;
      for (quadDegree_t j = 2; j <= num_points; ++j) {
        p3 = p2;
        p2 = p1;
        temp = 2 * j + alfbet;
        a = 2 * j * (j + alfbet) * (temp - 2.0);
        b = (temp - 1.0) *
            (alpha * alpha - beta * beta + temp * (temp - 2.0) * z);
        c = 2.0 * (j - 1 + alpha) * (j - 1 + beta) * temp;
        p1 = (b * p2 - c * p3) / a;
      }
      pp = (num_points * (alpha - beta - temp * z) * p1 +
            2.0 * (num_points + alpha) * (num_points + beta) * p2) /
           (temp * (1.0 - z * z));
      // p1 is now the desired jacobia polynomial. We next compute pp, its
      // derivative, by a standard relation involving p2, the polynomial of one
      // lower order
      z1 = z;
      z = z1 - p1 / pp;  // Newtons Formula
      if (abs(z - z1) <= 1e-17) {
        break;
      }
    }
    LF_VERIFY_MSG(its <= MAX_IT, "too many iterations.");

    points[i] = z;

    weights(i) = (exp(lgamma(alpha + num_points) + lgamma(beta + num_points) -
                      lgamma(num_points + 1.) -
                      lgamma(static_cast<double>(num_points) + alfbet + 1.0)) *
                  temp * pow(2.0, alfbet) / (pp * p2))
                     .convert_to<double>();
  }

  Eigen::VectorXd points_result(num_points);
  for (quadDegree_t i = 0; i < num_points; ++i) {
    points_result(i) = points[i].convert_to<double>();
  }
  // NOLINTEND(clang-analyzer-core.StackAddressEscape)

  return {points_result, weights};
}